

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  pointer pfVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  int32_t i;
  long lVar5;
  double dVar6;
  uint uVar7;
  undefined1 auVar8 [64];
  float fVar9;
  
  if ((this->quant_ == true) &&
     (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout ==
      true)) {
    Vector::mul(output,(this->qwo_).
                       super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                hidden);
  }
  else {
    Vector::mul(output,(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,hidden);
  }
  pfVar1 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar8 = ZEXT464((uint)*pfVar1);
  uVar3 = this->osz_;
  for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
    auVar2 = vmaxss_avx(auVar8._0_16_,ZEXT416((uint)pfVar1[uVar4]));
    auVar8 = ZEXT1664(auVar2);
  }
  fVar9 = 0.0;
  uVar7 = auVar8._0_4_;
  for (lVar5 = 0;
      pfVar1 = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start, lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
    dVar6 = exp((double)(pfVar1[lVar5] - auVar8._0_4_));
    auVar8 = ZEXT464(uVar7);
    (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[lVar5] = (float)dVar6;
    fVar9 = fVar9 + (float)dVar6;
    uVar3 = this->osz_;
  }
  for (uVar4 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar4; uVar4 = uVar4 + 1) {
    pfVar1[uVar4] = pfVar1[uVar4] / fVar9;
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
  if (quant_ && args_->qout) {
    output.mul(*qwo_, hidden);
  } else {
    output.mul(*wo_, hidden);
  }
  real max = output[0], z = 0.0;
  for (int32_t i = 0; i < osz_; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] /= z;
  }
}